

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathEqualValuesCommon
              (xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr arg1,xmlXPathObjectPtr arg2)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  int iVar6;
  undefined8 uVar7;
  void *pvVar8;
  xmlGenericErrorFunc p_Var9;
  bool bVar10;
  double dVar11;
  
  uVar3 = 0;
  uVar2 = 0;
  switch(arg1->type) {
  case XPATH_BOOLEAN:
    uVar2 = uVar3;
    switch(arg2->type) {
    case XPATH_BOOLEAN:
      bVar10 = arg1->boolval == arg2->boolval;
      goto LAB_001d98ee;
    case XPATH_NUMBER:
      bVar10 = arg2->floatval == 0.0;
LAB_001d98e4:
      uVar2 = (uint)!bVar10;
      break;
    case XPATH_STRING:
      uVar2 = 0;
      if (arg2->stringval != (xmlChar *)0x0) {
        bVar10 = *arg2->stringval == '\0';
        goto LAB_001d98e4;
      }
      break;
    default:
      goto switchD_001d96fb_caseD_5;
    case XPATH_USERS:
      pp_Var4 = __xmlGenericError();
      p_Var9 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      pvVar8 = *ppvVar5;
      uVar7 = 0x1b61;
      goto LAB_001d97bb;
    }
    bVar10 = arg1->boolval == uVar2;
LAB_001d98ee:
    uVar2 = (uint)bVar10;
    goto switchD_001d96fb_caseD_5;
  case XPATH_NUMBER:
    uVar2 = uVar3;
    switch(arg2->type) {
    case XPATH_BOOLEAN:
      bVar10 = arg1->floatval == 0.0;
LAB_001d9786:
      uVar2 = (uint)!bVar10;
LAB_001d9789:
      bVar10 = arg2->boolval == uVar2;
      goto LAB_001d98ee;
    case XPATH_STRING:
      valuePush(ctxt,arg2);
      xmlXPathNumberFunction(ctxt,1);
      arg2 = valuePop(ctxt);
    case XPATH_NUMBER:
      dVar11 = arg1->floatval;
LAB_001d9844:
      uVar2 = uVar3;
      if ((!NAN(dVar11)) && (dVar1 = arg2->floatval, !NAN(dVar1))) {
        iVar6 = ((0.0 < dVar11) - 1) + (uint)(0.0 < dVar11);
        if (ABS(dVar11) != INFINITY) {
          iVar6 = 0;
        }
        if (iVar6 == -1) {
          bVar10 = -INFINITY < dVar1;
        }
        else {
          if (iVar6 != 1) {
            uVar2 = 0;
            uVar3 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
            if (ABS(dVar1) != INFINITY) {
              uVar3 = uVar2;
            }
            if ((uVar3 != 0xffffffff) && (uVar3 != 1)) {
              uVar2 = -(uint)(dVar11 == dVar1) & 1;
            }
            goto switchD_001d96fb_caseD_5;
          }
          bVar10 = dVar1 < INFINITY;
        }
        uVar2 = (uint)!bVar10;
      }
    default:
      goto switchD_001d96fb_caseD_5;
    case XPATH_USERS:
      pp_Var4 = __xmlGenericError();
      p_Var9 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      pvVar8 = *ppvVar5;
      uVar7 = 0x1b9c;
    }
    break;
  case XPATH_STRING:
    uVar2 = uVar3;
    switch(arg2->type) {
    case XPATH_BOOLEAN:
      uVar2 = 0;
      if (arg1->stringval != (xmlChar *)0x0) {
        bVar10 = *arg1->stringval == '\0';
        goto LAB_001d9786;
      }
      goto LAB_001d9789;
    case XPATH_NUMBER:
      valuePush(ctxt,arg1);
      xmlXPathNumberFunction(ctxt,1);
      arg1 = valuePop(ctxt);
      dVar11 = arg1->floatval;
      goto LAB_001d9844;
    case XPATH_STRING:
      uVar2 = xmlStrEqual(arg1->stringval,arg2->stringval);
      break;
    case XPATH_USERS:
      pp_Var4 = __xmlGenericError();
      p_Var9 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      pvVar8 = *ppvVar5;
      uVar7 = 0x1bdb;
      goto LAB_001d97bb;
    }
  default:
    goto switchD_001d96fb_caseD_5;
  case XPATH_USERS:
    pp_Var4 = __xmlGenericError();
    p_Var9 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    pvVar8 = *ppvVar5;
    uVar7 = 0x1be8;
  }
LAB_001d97bb:
  (*p_Var9)(pvVar8,"Unimplemented block at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",uVar7
           );
  uVar2 = 0;
switchD_001d96fb_caseD_5:
  xmlXPathReleaseObject(ctxt->context,arg1);
  xmlXPathReleaseObject(ctxt->context,arg2);
  return uVar2;
}

Assistant:

static int
xmlXPathEqualValuesCommon(xmlXPathParserContextPtr ctxt,
  xmlXPathObjectPtr arg1, xmlXPathObjectPtr arg2) {
    int ret = 0;
    /*
     *At this point we are assured neither arg1 nor arg2
     *is a nodeset, so we can just pick the appropriate routine.
     */
    switch (arg1->type) {
        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	    xmlGenericError(xmlGenericErrorContext,
		    "Equal: undefined\n");
#endif
	    break;
        case XPATH_BOOLEAN:
	    switch (arg2->type) {
	        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: undefined\n");
#endif
		    break;
		case XPATH_BOOLEAN:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: %d boolean %d \n",
			    arg1->boolval, arg2->boolval);
#endif
		    ret = (arg1->boolval == arg2->boolval);
		    break;
		case XPATH_NUMBER:
		    ret = (arg1->boolval ==
			   xmlXPathCastNumberToBoolean(arg2->floatval));
		    break;
		case XPATH_STRING:
		    if ((arg2->stringval == NULL) ||
			(arg2->stringval[0] == 0)) ret = 0;
		    else
			ret = 1;
		    ret = (arg1->boolval == ret);
		    break;
		case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
		case XPATH_POINT:
		case XPATH_RANGE:
		case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
		    TODO
		    break;
		case XPATH_NODESET:
		case XPATH_XSLT_TREE:
		    break;
	    }
	    break;
        case XPATH_NUMBER:
	    switch (arg2->type) {
	        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: undefined\n");
#endif
		    break;
		case XPATH_BOOLEAN:
		    ret = (arg2->boolval==
			   xmlXPathCastNumberToBoolean(arg1->floatval));
		    break;
		case XPATH_STRING:
		    valuePush(ctxt, arg2);
		    xmlXPathNumberFunction(ctxt, 1);
		    arg2 = valuePop(ctxt);
                    /* Falls through. */
		case XPATH_NUMBER:
		    /* Hand check NaN and Infinity equalities */
		    if (xmlXPathIsNaN(arg1->floatval) ||
			    xmlXPathIsNaN(arg2->floatval)) {
		        ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == 1) {
		        if (xmlXPathIsInf(arg2->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == -1) {
			if (xmlXPathIsInf(arg2->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == 1) {
			if (xmlXPathIsInf(arg1->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == -1) {
			if (xmlXPathIsInf(arg1->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else {
		        ret = (arg1->floatval == arg2->floatval);
		    }
		    break;
		case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
		case XPATH_POINT:
		case XPATH_RANGE:
		case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
		    TODO
		    break;
		case XPATH_NODESET:
		case XPATH_XSLT_TREE:
		    break;
	    }
	    break;
        case XPATH_STRING:
	    switch (arg2->type) {
	        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: undefined\n");
#endif
		    break;
		case XPATH_BOOLEAN:
		    if ((arg1->stringval == NULL) ||
			(arg1->stringval[0] == 0)) ret = 0;
		    else
			ret = 1;
		    ret = (arg2->boolval == ret);
		    break;
		case XPATH_STRING:
		    ret = xmlStrEqual(arg1->stringval, arg2->stringval);
		    break;
		case XPATH_NUMBER:
		    valuePush(ctxt, arg1);
		    xmlXPathNumberFunction(ctxt, 1);
		    arg1 = valuePop(ctxt);
		    /* Hand check NaN and Infinity equalities */
		    if (xmlXPathIsNaN(arg1->floatval) ||
			    xmlXPathIsNaN(arg2->floatval)) {
		        ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == 1) {
			if (xmlXPathIsInf(arg2->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == -1) {
			if (xmlXPathIsInf(arg2->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == 1) {
			if (xmlXPathIsInf(arg1->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == -1) {
			if (xmlXPathIsInf(arg1->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else {
		        ret = (arg1->floatval == arg2->floatval);
		    }
		    break;
		case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
		case XPATH_POINT:
		case XPATH_RANGE:
		case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
		    TODO
		    break;
		case XPATH_NODESET:
		case XPATH_XSLT_TREE:
		    break;
	    }
	    break;
        case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
	case XPATH_POINT:
	case XPATH_RANGE:
	case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
	    TODO
	    break;
	case XPATH_NODESET:
	case XPATH_XSLT_TREE:
	    break;
    }
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}